

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O3

void * OPENSSL_lh_retrieve_key
                 (_LHASH *lh,void *key,uint32_t key_hash,_func_int_void_ptr_void_ptr *cmp_key)

{
  LHASH_ITEM **ppLVar1;
  LHASH_ITEM *pLVar2;
  int iVar3;
  ulong uVar4;
  lhash_item_st **pplVar5;
  LHASH_ITEM *pLVar6;
  void *pvVar7;
  
  ppLVar1 = lh->buckets;
  uVar4 = (ulong)key_hash % lh->num_buckets;
  pvVar7 = (void *)0x0;
  pLVar2 = ppLVar1[uVar4];
  if (pLVar2 != (LHASH_ITEM *)0x0) {
    iVar3 = (*cmp_key)(key,pLVar2->data);
    if (iVar3 == 0) {
      pplVar5 = ppLVar1 + uVar4;
    }
    else {
      do {
        pLVar6 = pLVar2;
        pLVar2 = pLVar6->next;
        if (pLVar2 == (lhash_item_st *)0x0) {
          return (void *)0x0;
        }
        iVar3 = (*cmp_key)(key,pLVar2->data);
      } while (iVar3 != 0);
      pplVar5 = &pLVar6->next;
    }
    if (*pplVar5 == (lhash_item_st *)0x0) {
      pvVar7 = (void *)0x0;
    }
    else {
      pvVar7 = (*pplVar5)->data;
    }
  }
  return pvVar7;
}

Assistant:

void *OPENSSL_lh_retrieve_key(const _LHASH *lh, const void *key,
                              uint32_t key_hash,
                              int (*cmp_key)(const void *key,
                                             const void *value)) {
  LHASH_ITEM **next_ptr = get_next_ptr_by_key(lh, key, key_hash, cmp_key);
  return *next_ptr == NULL ? NULL : (*next_ptr)->data;
}